

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackIFWPackage.cxx
# Opt level: O2

void __thiscall
cmCPackIFWPackage::DependenceStruct::DependenceStruct(DependenceStruct *this,string *dependence)

{
  long lVar1;
  string asStack_48 [32];
  
  (this->Name)._M_dataplus._M_p = (pointer)&(this->Name).field_2;
  (this->Name)._M_string_length = 0;
  (this->Name).field_2._M_local_buf[0] = '\0';
  (this->Compare).Type = 0;
  (this->Compare).Value._M_dataplus._M_p = (pointer)&(this->Compare).Value.field_2;
  (this->Compare).Value._M_string_length = 0;
  (this->Compare).Value.field_2._M_local_buf[0] = '\0';
  lVar1 = std::__cxx11::string::find((char *)dependence,0x4aaf88);
  if (lVar1 == -1) {
    lVar1 = std::__cxx11::string::find((char *)dependence,0x4aaf8b);
    if (lVar1 == -1) {
      lVar1 = std::__cxx11::string::find((char *)dependence,0x4d143b);
      if (lVar1 == -1) {
        lVar1 = std::__cxx11::string::find((char *)dependence,0x4d7e5e);
        if (lVar1 == -1) {
          lVar1 = std::__cxx11::string::find((char *)dependence,0x4b7d91);
          if (lVar1 == -1) {
            std::__cxx11::string::string(asStack_48,(string *)dependence);
            goto LAB_0029b3eb;
          }
          (this->Compare).Type = 4;
          std::__cxx11::string::substr((ulong)asStack_48,(ulong)dependence);
        }
        else {
          (this->Compare).Type = 1;
          std::__cxx11::string::substr((ulong)asStack_48,(ulong)dependence);
        }
      }
      else {
        (this->Compare).Type = 2;
        std::__cxx11::string::substr((ulong)asStack_48,(ulong)dependence);
      }
    }
    else {
      (this->Compare).Type = 5;
      std::__cxx11::string::substr((ulong)asStack_48,(ulong)dependence);
    }
  }
  else {
    (this->Compare).Type = 3;
    std::__cxx11::string::substr((ulong)asStack_48,(ulong)dependence);
  }
  std::__cxx11::string::operator=((string *)&(this->Compare).Value,asStack_48);
  std::__cxx11::string::~string(asStack_48);
  std::__cxx11::string::substr((ulong)asStack_48,(ulong)dependence);
LAB_0029b3eb:
  std::__cxx11::string::_M_assign((string *)this);
  std::__cxx11::string::~string(asStack_48);
  return;
}

Assistant:

cmCPackIFWPackage::DependenceStruct::DependenceStruct(
  const std::string &dependence)
{
  // Search compare section
  size_t pos = std::string::npos;
  if((pos = dependence.find("<=")) != std::string::npos)
    {
    Compare.Type = CompareLessOrEqual;
    Compare.Value = dependence.substr(pos + 2);
    }
  else if((pos = dependence.find(">=")) != std::string::npos)
    {
    Compare.Type = CompareGreaterOrEqual;
    Compare.Value = dependence.substr(pos + 2);
    }
  else if((pos = dependence.find("<")) != std::string::npos)
    {
    Compare.Type = CompareLess;
    Compare.Value = dependence.substr(pos + 1);
    }
  else if((pos = dependence.find("=")) != std::string::npos)
    {
    Compare.Type = CompareEqual;
    Compare.Value = dependence.substr(pos + 1);
    }
  else if((pos = dependence.find(">")) != std::string::npos)
    {
    Compare.Type = CompareGreater;
    Compare.Value = dependence.substr(pos + 1);
    }
  Name = pos == std::string::npos ? dependence : dependence.substr(0, pos);
}